

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuEither.hpp
# Opt level: O2

void __thiscall
tcu::Either<tcu::(anonymous_namespace)::TestClassWithConstructor,_int>::release
          (Either<tcu::(anonymous_namespace)::TestClassWithConstructor,_int> *this)

{
  if (this->m_isFirst == true) {
    anon_unknown_0::TestClassWithConstructor::~TestClassWithConstructor((this->field_1).m_first);
  }
  this->m_isFirst = true;
  (this->field_1).m_first = (TestClassWithConstructor *)0x0;
  return;
}

Assistant:

void Either<First, Second>::release (void)
{
	if (m_isFirst)
		m_first->~First();
	else
		m_second->~Second();

	m_isFirst	= true;
	m_first		= DE_NULL;
}